

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::instruction_to_result_type
          (Compiler *this,uint32_t *result_type,uint32_t *result_id,Op op,uint32_t *args,
          uint32_t length)

{
  bool local_3e;
  bool local_3d;
  uint32_t local_3c;
  bool has_result_type;
  bool has_result_id;
  uint32_t *puStack_38;
  uint32_t length_local;
  uint32_t *args_local;
  uint32_t *puStack_28;
  Op op_local;
  uint32_t *result_id_local;
  uint32_t *result_type_local;
  Compiler *this_local;
  
  if (length < 2) {
    this_local._7_1_ = false;
  }
  else {
    local_3d = false;
    local_3e = false;
    local_3c = length;
    puStack_38 = args;
    args_local._4_4_ = op;
    puStack_28 = result_id;
    result_id_local = result_type;
    result_type_local = (uint32_t *)this;
    spv::HasResultAndType(op,&local_3d,&local_3e);
    if (((local_3d & 1U) == 0) || ((local_3e & 1U) == 0)) {
      this_local._7_1_ = false;
    }
    else {
      *result_id_local = *puStack_38;
      *puStack_28 = puStack_38[1];
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::instruction_to_result_type(uint32_t &result_type, uint32_t &result_id, spv::Op op,
                                          const uint32_t *args, uint32_t length)
{
	if (length < 2)
		return false;

	bool has_result_id = false, has_result_type = false;
	HasResultAndType(op, &has_result_id, &has_result_type);
	if (has_result_id && has_result_type)
	{
		result_type = args[0];
		result_id = args[1];
		return true;
	}
	else
		return false;
}